

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::printSolution(HModel *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  ostream *poVar5;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  size_type __n;
  long lVar9;
  long lVar10;
  size_type sVar11;
  char buff [5];
  vector<double,_std::allocator<double>_> dual;
  vector<double,_std::allocator<double>_> value;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowValue;
  vector<double,_std::allocator<double>_> colDual;
  vector<double,_std::allocator<double>_> colValue;
  allocator_type local_bd [5];
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,&this->workValue);
  iVar1 = this->numRow;
  if (0 < (long)iVar1) {
    piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[lVar9]] = pdVar4[lVar9];
      lVar9 = lVar9 + 1;
    } while (iVar1 != lVar9);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,&this->workDual);
  iVar1 = this->numRow;
  lVar9 = (long)iVar1;
  if (0 < lVar9) {
    piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[lVar8]] = 0.0;
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  __n = (size_type)this->numCol;
  if (0 < (long)__n) {
    pdVar4 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    do {
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar11] =
           pdVar4[sVar11] *
           local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[sVar11];
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar11] =
           local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[sVar11] / pdVar4[sVar11];
      sVar11 = sVar11 + 1;
    } while (__n != sVar11);
  }
  if (0 < iVar1) {
    pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[__n + lVar8] =
           local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[__n + lVar8] / pdVar4[lVar8];
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[__n + lVar8] =
           pdVar4[lVar8] *
           local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[__n + lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_40,__n,(allocator_type *)&local_58);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58,(long)this->numCol,(allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,(long)this->numRow,(allocator_type *)&local_88);
  std::vector<double,_std::allocator<double>_>::vector(&local_88,(long)this->numRow,local_bd);
  iVar1 = this->numRow;
  lVar9 = (long)iVar1;
  if (0 < lVar9) {
    iVar2 = this->numCol;
    lVar8 = 0;
    do {
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] =
           -local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2 + lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  iVar2 = this->numCol;
  lVar8 = (long)iVar2;
  if (0 < lVar8) {
    lVar10 = 0;
    do {
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] =
           local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] =
           local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar8 + lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  if (0 < iVar2) {
    lVar9 = 0;
    do {
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] =
           local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Col value: ",0xb);
  if (0 < this->numCol) {
    lVar9 = 0;
    do {
      sprintf((char *)local_bd,"%2.2f ",
              local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen((char *)local_bd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_bd,sVar6);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Col dual:  ",0xb);
  if (0 < this->numCol) {
    lVar9 = 0;
    do {
      sprintf((char *)local_bd,"%2.2f ",
              local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen((char *)local_bd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_bd,sVar6);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Row value: ",0xb);
  if (0 < this->numRow) {
    lVar9 = 0;
    do {
      sprintf((char *)local_bd,"%2.2f ",
              local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen((char *)local_bd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_bd,sVar6);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numRow);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Row dual:  ",0xb);
  if (0 < this->numRow) {
    lVar9 = 0;
    do {
      sprintf((char *)local_bd,"%2.2f ",
              local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar6 = strlen((char *)local_bd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_bd,sVar6);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numRow);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar7 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HModel::printSolution() {

	//*************** part 1 : in .solve() 
	// Take primal solution
	vector<double> value = workValue;
	for (int iRow = 0; iRow < numRow; iRow++)
		value[basicIndex[iRow]] = baseValue[iRow];

	// Take dual solution
	vector<double> dual = workDual;
	for (int iRow = 0; iRow < numRow; iRow++)
		dual[basicIndex[iRow]] = 0;

	// Take non basic flag and move don't need those?
	//houtput.Nflag = Nflag_;
	//houtput.Nmove = Nmove_;

	// Scale back 
	for (int iCol = 0; iCol < numCol; iCol++) {
		value[iCol] *= colScale[iCol];
		dual[iCol] /= colScale[iCol];

	}
	for (int iRow = 0, iTot = numCol; iRow < numRow; iRow++, iTot++) {
		value[iTot] /= rowScale[iRow];
		dual[iTot] *= rowScale[iRow];
	}
	
	//************** part 2: gepr and gedu

	// Now we can get the solution
	vector<double> colValue(numCol), colDual(numCol); 
	vector<double> rowValue(numRow), rowDual(numRow);
	
	// hems_gepr hems_gedu after model has been solved 
	// always call that function with numRow + 1 for rowListSize and same for col 
	//hems_gepr(&returnCode, 0, numRow + 1), numCol + 1, 0, 0, &rowValue[0], &colValue[0]);
	double *valuePtr = &value[0];
//    if (rowListSize > numRow) {
        for (int i = 0; i < numRow; i++)
            rowValue[i] = -valuePtr[i + numCol];
//    } else {
//        for (int i = 0; i < rowListSize; i++)
//            rowValue[i] = -valuePtr[rowList[i] + numCol - 1];
//    }
//    if (colListSize > numCol) {
        for (int i = 0; i < numCol; i++)
            colValue[i] = valuePtr[i];
//    } else {
 //       for (int i = 0; i < colListSize; i++)
  //          colValue[i] = valuePtr[colList[i] - 1];
   // }
    
    //hems_gedu(&returnCode, 0, numRow + 1, numCol + 1, 0, 0, &rowDual[0], &colDual[0]);
	
//    if (rowListSize > numRow) {
        for (int i = 0; i < numRow; i++)
            rowDual[i] = dual[i + numCol];
//    } else {
  //      for (int i = 0; i < rowListSize; i++)
   //         rowDual[i] = dual[rowList[i] + numCol - 1];
   // }

 //   if (colListSize > numCol) {
        for (int i = 0; i < numCol; i++)
            colDual[i] = dual[i];
 //   } else {
  //      for (int i = 0; i < colListSize; i++)
   //         colDual[i] = dual[colList[i] - 1];
   // }
    //*rtcod = 0;*/
    
    char buff [5];
    cout<<endl<<"Col value: ";
    for (int i=0;i<numCol;i++) {
    	sprintf(buff, "%2.2f ", colValue[i]); 
    	cout<<setw(5)<<buff; }  //cout<< colValue[i] <<" ";
    cout<<endl<<"Col dual:  ";
    for (int i=0;i<numCol;i++) {
    	sprintf(buff, "%2.2f ", colDual[i]);
    	cout<<setw(5)<<buff; }  //cout<< colDual[i] <<" ";
    cout<<endl<<"Row value: ";
    for (int i=0;i<numRow;i++) {
      	sprintf(buff, "%2.2f ", rowValue[i]);  
      	cout<<setw(5)<<buff; }  //cout<< rowValue[i] <<" ";
    cout<<endl<<"Row dual:  ";
    for (int i=0;i<numRow;i++) {
    	sprintf(buff, "%2.2f ", rowDual[i]);  
    	cout<<setw(5)<<buff; }  //cout<< rowDual[i] <<" "; 
    cout<<endl<<endl;
}